

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O1

void bsp_get_boundaries(void *handle,float *boundaries)

{
  float fVar1;
  long lVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  float fVar11;
  
  uVar4 = array_count((void *)**handle);
  if ((0 < (int)uVar4) && (uVar5 = (ulong)*(byte *)((long)handle + 8), uVar5 != 0)) {
    lVar2 = *handle;
    uVar6 = 0;
    do {
      pfVar8 = *(float **)(lVar2 + uVar6 * 8);
      boundaries[uVar6 * 2] = *pfVar8;
      boundaries[uVar6 * 2 + 1] = *pfVar8;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    uVar6 = 2;
    if (2 < (int)uVar4) {
      uVar6 = (ulong)uVar4;
    }
    uVar7 = 0;
    do {
      if (uVar4 != 1) {
        lVar2 = *(long *)(*handle + uVar7 * 8);
        pfVar8 = boundaries + uVar7 * 2 + 1;
        fVar11 = boundaries[uVar7 * 2];
        uVar9 = 1;
        do {
          fVar1 = *(float *)(lVar2 + uVar9 * 4);
          pfVar10 = boundaries + uVar7 * 2;
          fVar3 = fVar1;
          if ((fVar1 < fVar11) ||
             (pfVar10 = pfVar8, fVar3 = fVar11, *pfVar8 <= fVar1 && fVar1 != *pfVar8)) {
            fVar11 = fVar3;
            *pfVar10 = fVar1;
          }
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

void
bsp_get_boundaries(
    void * handle,
    float * boundaries )
{
    bsp_tree * tree;
    int i, j, cnt;
    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    assert( tree->pointarrays != NULL );
    assert( tree->pointarrays[0] != NULL );
    if ( (cnt = array_count( tree->pointarrays[0] )) > 0 ) {
        for ( j = 0; j < tree->dimensions; j++ ) {
            boundaries[j*2] = tree->pointarrays[j][0];
            boundaries[j*2+1] = tree->pointarrays[j][0];
        }
        for ( j = 0; j < tree->dimensions; j++ ) {
            int min, max;
            min = j*2;
            max = j*2+1;
            for ( i = 1; i < cnt; i++ ) {
                /* MIN() */
                if ( boundaries[min] > tree->pointarrays[j][i] )
                    boundaries[min] = tree->pointarrays[j][i];
                /* MAX() */
                else if ( boundaries[max] < tree->pointarrays[j][i] )
                    boundaries[max] = tree->pointarrays[j][i];
            }
        }
    }
}